

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall re2::DFA::ResetCache(DFA *this,RWLocker *cache_lock)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  LogMessage local_190;
  
  bVar1 = cache_lock->writing_;
  RWLocker::LockForWriting(cache_lock);
  if ((bVar1 == true) && (this->cache_warned_ == false)) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x486,0
              );
    poVar2 = std::operator<<((ostream *)&local_190.str_,"DFA memory cache could be too small: ");
    poVar2 = std::operator<<(poVar2,"only room for ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," states.");
    LogMessage::~LogMessage(&local_190);
    this->cache_warned_ = true;
  }
  for (lVar3 = 0xf0; lVar3 != 0x170; lVar3 = lVar3 + 0x10) {
    *(undefined8 *)((long)this + lVar3 + -8) = 0;
    *(undefined4 *)((long)&this->prog_ + lVar3) = 0xffffffff;
  }
  ClearCache(this);
  this->mem_budget_ = this->state_budget_;
  return;
}

Assistant:

void DFA::ResetCache(RWLocker* cache_lock) {
  // Re-acquire the cache_mutex_ for writing (exclusive use).
  bool was_writing = cache_lock->IsLockedForWriting();
  cache_lock->LockForWriting();

  // If we already held cache_mutex_ for writing, it means
  // this invocation of Search() has already reset the
  // cache once already.  That's a pretty clear indication
  // that the cache is too small.  Warn about that, once.
  // TODO(rsc): Only warn if state_cache_.size() < some threshold.
  if (was_writing && !cache_warned_) {
    LOG(INFO) << "DFA memory cache could be too small: "
              << "only room for " << state_cache_.size() << " states.";
    cache_warned_ = true;
  }

  // Clear the cache, reset the memory budget.
  for (int i = 0; i < kMaxStart; i++) {
    start_[i].start = NULL;
    start_[i].firstbyte.store(kFbUnknown, std::memory_order_relaxed);
  }
  ClearCache();
  mem_budget_ = state_budget_;
}